

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

void __thiscall
testing::internal::TypedExpectation<void_(int,_double,_double)>::TypedExpectation
          (TypedExpectation<void_(int,_double,_double)> *this,
          FunctionMockerBase<void_(int,_double,_double)> *owner,char *a_file,int a_line,
          string *a_source_text,ArgumentMatcherTuple *m)

{
  ExpectationBase::ExpectationBase(&this->super_ExpectationBase,a_file,a_line,a_source_text);
  (this->super_ExpectationBase)._vptr_ExpectationBase =
       (_func_int **)&PTR__TypedExpectation_002b4bb8;
  this->owner_ = owner;
  std::_Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<double>,_testing::Matcher<double>_>
  ::_Tuple_impl(&(this->matchers_).
                 super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<double>,_testing::Matcher<double>_>
                ,&m->
                  super__Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<double>,_testing::Matcher<double>_>
               );
  A<std::tuple<int,double,double>const&>();
  (this->repeated_action_).impl_.value_ = (ActionInterface<void_(int,_double,_double)> *)0x0;
  (this->repeated_action_).impl_.link_.next_ = &(this->repeated_action_).impl_.link_;
  return;
}

Assistant:

TypedExpectation(FunctionMockerBase<F>* owner,
                   const char* a_file, int a_line, const string& a_source_text,
                   const ArgumentMatcherTuple& m)
      : ExpectationBase(a_file, a_line, a_source_text),
        owner_(owner),
        matchers_(m),
        // By default, extra_matcher_ should match anything.  However,
        // we cannot initialize it with _ as that triggers a compiler
        // bug in Symbian's C++ compiler (cannot decide between two
        // overloaded constructors of Matcher<const ArgumentTuple&>).
        extra_matcher_(A<const ArgumentTuple&>()),
        repeated_action_(DoDefault()) {}